

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O0

bool Pl_Flate::zopfli_check_env(QPDFLogger *logger)

{
  bool bVar1;
  runtime_error *this;
  __shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> local_88;
  undefined4 local_78;
  allocator<char> local_61;
  string local_60;
  undefined1 local_39;
  undefined1 local_38 [7];
  bool is_set;
  string value;
  QPDFLogger *logger_local;
  
  value.field_2._8_8_ = logger;
  bVar1 = zopfli_supported();
  if (bVar1) {
    return true;
  }
  std::__cxx11::string::string((string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"QPDF_ZOPFLI",&local_61);
  bVar1 = QUtil::get_env(&local_60,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_39 = bVar1;
  if (((!bVar1) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_38,"disabled"), bVar1)) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"silent"), bVar1)) {
    logger_local._7_1_ = true;
  }
  else {
    if (value.field_2._8_8_ == 0) {
      QPDFLogger::defaultLogger();
      value.field_2._8_8_ =
           std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::get(&local_88);
      std::shared_ptr<QPDFLogger>::~shared_ptr((shared_ptr<QPDFLogger> *)&local_88);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"force");
    if (bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"QPDF_ZOPFLI=force, and zopfli support is not enabled")
      ;
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    QPDFLogger::warn((QPDFLogger *)value.field_2._8_8_,
                     "QPDF_ZOPFLI is set, but libqpdf was not built with zopfli support\n");
    QPDFLogger::warn((QPDFLogger *)value.field_2._8_8_,
                     "Set QPDF_ZOPFLI=silent to suppress this warning and use zopfli when available.\n"
                    );
    logger_local._7_1_ = false;
  }
  local_78 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return logger_local._7_1_;
}

Assistant:

bool
Pl_Flate::zopfli_check_env(QPDFLogger* logger)
{
    if (Pl_Flate::zopfli_supported()) {
        return true;
    }
    std::string value;
    auto is_set = QUtil::get_env("QPDF_ZOPFLI", &value);
    if (!is_set || value == "disabled" || value == "silent") {
        return true;
    }
    if (!logger) {
        logger = QPDFLogger::defaultLogger().get();
    }

    // This behavior is known in QPDFJob (for the --zopfli argument), Pl_Flate.hh, README.md,
    // and the manual. Do a case-insensitive search for zopfli if changing the behavior.
    if (value == "force") {
        throw std::runtime_error("QPDF_ZOPFLI=force, and zopfli support is not enabled");
    }
    logger->warn("QPDF_ZOPFLI is set, but libqpdf was not built with zopfli support\n");
    logger->warn(
        "Set QPDF_ZOPFLI=silent to suppress this warning and use zopfli when available.\n");
    return false;
}